

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

ComponentPtr __thiscall
libcellml::ComponentEntity::takeComponent
          (ComponentEntity *this,string *name,bool searchEncapsulated)

{
  const_iterator __position;
  ComponentImpl *this_00;
  size_type sVar1;
  char in_CL;
  _func_int **pp_Var2;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  ulong uVar4;
  ComponentPtr CVar5;
  ComponentEntity local_50;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = (_func_int **)0x0;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl = (EntityImpl *)0x0;
  __position = ComponentEntityImpl::findComponent
                         ((ComponentEntityImpl *)name->_M_string_length,
                          (string *)CONCAT71(in_register_00000011,searchEncapsulated));
  sVar1 = name->_M_string_length;
  if (__position._M_current == *(shared_ptr<libcellml::Component> **)(sVar1 + 0x58)) {
    _Var3._M_pi = extraout_RDX;
    if (in_CL != '\0') {
      uVar4 = 0;
      pp_Var2 = (_func_int **)0x0;
      while ((uVar4 < (ulong)((long)__position._M_current - *(long *)(sVar1 + 0x50) >> 4) &&
             (pp_Var2 == (_func_int **)0x0))) {
        component(&local_50,(size_t)name);
        takeComponent((ComponentEntity *)&local_40,
                      (string *)
                      local_50.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity,
                      searchEncapsulated);
        std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)this,&local_40)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
        uVar4 = uVar4 + 1;
        sVar1 = name->_M_string_length;
        __position._M_current = *(shared_ptr<libcellml::Component> **)(sVar1 + 0x58);
        _Var3._M_pi = extraout_RDX_01;
        pp_Var2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
      }
    }
  }
  else {
    std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)this,
               &(__position._M_current)->
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::erase((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             *)(name->_M_string_length + 0x50),__position);
    this_00 = Component::pFunc((Component *)
                               (this->super_NamedEntity).super_ParentedEntity.super_Entity.
                               _vptr_Entity);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    _Var3._M_pi = extraout_RDX_00;
  }
  CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr ComponentEntity::takeComponent(const std::string &name, bool searchEncapsulated)
{
    ComponentPtr foundComponent = nullptr;
    auto result = pFunc()->findComponent(name);
    if (result != pFunc()->mComponents.end()) {
        foundComponent = *result;
        pFunc()->mComponents.erase(result);
        foundComponent->pFunc()->removeParent();
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !foundComponent; ++i) {
            foundComponent = component(i)->takeComponent(name, searchEncapsulated);
        }
    }

    return foundComponent;
}